

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeStringConst(TranslateToFuzzReader *this)

{
  Index IVar1;
  StringConst *pSVar2;
  string local_3c8;
  string_view local_3a8;
  string local_398 [32];
  undefined1 local_378 [16];
  stringstream local_368 [8];
  stringstream wtf16;
  undefined1 local_358 [376];
  string local_1e0;
  ulong local_1b0;
  size_t end;
  size_t i;
  stringstream local_198 [7];
  bool lastWasLeadingSurrogate;
  stringstream wtf8;
  ostream local_188 [376];
  TranslateToFuzzReader *local_10;
  TranslateToFuzzReader *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  i._7_1_ = 0;
  end = 0;
  IVar1 = upTo(this,4);
  local_1b0 = (ulong)IVar1;
  do {
    if (local_1b0 <= end) {
      std::__cxx11::stringstream::stringstream(local_368);
      std::__cxx11::stringstream::str();
      local_378 = std::__cxx11::string::operator_cast_to_basic_string_view(local_398);
      wasm::String::convertWTF8ToWTF16(local_358,local_378._0_8_,local_378._8_8_);
      std::__cxx11::string::~string(local_398);
      std::__cxx11::stringstream::str();
      Name::Name((Name *)&local_3a8,&local_3c8);
      pSVar2 = Builder::makeStringConst(&this->builder,(Name)local_3a8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::stringstream::~stringstream(local_368);
      std::__cxx11::stringstream::~stringstream(local_198);
      return (Expression *)pSVar2;
    }
    IVar1 = upTo(this,6);
    switch(IVar1) {
    case 0:
      IVar1 = upTo(this,0x400);
      std::__cxx11::to_string(&local_1e0,IVar1);
      std::operator<<(local_188,(string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      break;
    case 1:
      std::operator<<(local_188,anon_var_dwarf_bed01);
      break;
    case 2:
      std::operator<<(local_188,anon_var_dwarf_bed1c);
      break;
    case 3:
      std::operator<<(local_188,anon_var_dwarf_bed29);
      break;
    case 4:
      std::operator<<(local_188,anon_var_dwarf_bed36);
      i._7_1_ = 1;
      goto LAB_001c7433;
    case 5:
      if ((i._7_1_ & 1) == 0) {
        std::operator<<(local_188,anon_var_dwarf_bed43);
        break;
      }
      goto LAB_001c7433;
    }
    i._7_1_ = 0;
LAB_001c7433:
    end = end + 1;
  } while( true );
}

Assistant:

Expression* TranslateToFuzzReader::makeStringConst() {
  // Construct an interesting WTF-8 string from parts and use string.const.
  std::stringstream wtf8;
  bool lastWasLeadingSurrogate = false;
  for (size_t i = 0, end = upTo(4); i < end; ++i) {
    switch (upTo(6)) {
      case 0:
        // A simple ascii string.
        wtf8 << std::to_string(upTo(1024));
        break;
      case 1:
        // '£'
        wtf8 << "\xC2\xA3";
        break;
      case 2:
        // '€'
        wtf8 << "\xE2\x82\xAC";
        break;
      case 3:
        // '𐍈'
        wtf8 << "\xF0\x90\x8D\x88";
        break;
      case 4:
        // The leading surrogate in '𐍈'
        wtf8 << "\xED\xA0\x80";
        lastWasLeadingSurrogate = true;
        continue;
      case 5:
        if (lastWasLeadingSurrogate) {
          // Avoid invalid WTF-8.
          continue;
        }
        // The trailing surrogate in '𐍈'
        wtf8 << "\xED\xBD\x88";
        break;
    }
    lastWasLeadingSurrogate = false;
  }
  std::stringstream wtf16;
  // TODO: Use wtf16.view() once we have C++20.
  String::convertWTF8ToWTF16(wtf16, wtf8.str());
  return builder.makeStringConst(wtf16.str());
}